

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestlogonAtLogonStartTimeFixturelogonAtLogonStartTime::RunImpl
          (TestlogonAtLogonStartTimeFixturelogonAtLogonStartTime *this)

{
  AssertException *e;
  MemoryOutStream stream;
  exception *e_1;
  undefined1 local_648 [8];
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper fixtureHelper;
  bool ctorOk;
  TestlogonAtLogonStartTimeFixturelogonAtLogonStartTime *this_local;
  
  fixtureHelper.m_details._7_1_ = 0;
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper::
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper
            ((logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper *)local_648,
             &(this->super_Test).m_details);
  fixtureHelper.m_details._7_1_ = 1;
  UnitTest::ExecuteTest<SuiteSessionTests::logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper>
            ((logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper *)local_648,
             &(this->super_Test).m_details);
  logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper::
  ~logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper
            ((logonAtLogonStartTimeFixturelogonAtLogonStartTimeHelper *)local_648);
  return;
}

Assistant:

TEST_FIXTURE(logonAtLogonStartTimeFixture, logonAtLogonStartTime)
{
  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );

  CHECK_EQUAL( 0, toLogon );
  CHECK_EQUAL( 0, toLogout );
  process_sleep( 1 );

  object->next( createLogon( "ISLD", "TW", 1 ), UtcTimeStamp() );
  object->next( createHeartbeat( "ISLD", "TW", 2 ), UtcTimeStamp() );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 0, toLogout );

  process_sleep( 2 );
  object->next();
  CHECK_EQUAL( 1, toLogon );
  CHECK_EQUAL( 1, toLogout );
}